

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

void __thiscall QFileDialogTreeView::keyPressEvent(QFileDialogTreeView *this,QKeyEvent *e)

{
  bool bVar1;
  
  bVar1 = QFileDialogPrivate::itemViewKeyboardEvent(this->d_ptr,e);
  if (!bVar1) {
    QTreeView::keyPressEvent(&this->super_QTreeView,e);
  }
  e[0xc] = (QKeyEvent)0x1;
  return;
}

Assistant:

void QFileDialogTreeView::keyPressEvent(QKeyEvent *e)
{
#ifdef QT_KEYPAD_NAVIGATION
    if (QApplication::navigationMode() == Qt::NavigationModeKeypadDirectional) {
        QTreeView::keyPressEvent(e);
        return;
    }
#endif // QT_KEYPAD_NAVIGATION

    if (!d_ptr->itemViewKeyboardEvent(e))
        QTreeView::keyPressEvent(e);
    e->accept();
}